

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O0

void __thiscall
vmips::CFGNode::branch_existing<vmips::beqz,std::shared_ptr<vmips::VirtReg>&>
          (CFGNode *this,shared_ptr<vmips::CFGNode> *node,shared_ptr<vmips::VirtReg> *args)

{
  shared_ptr<vmips::Instruction> local_60;
  undefined1 local_50 [8];
  shared_ptr<vmips::beqz> instr;
  weak_ptr<vmips::CFGNode> local_30;
  shared_ptr<vmips::VirtReg> *local_20;
  shared_ptr<vmips::VirtReg> *args_local;
  shared_ptr<vmips::CFGNode> *node_local;
  CFGNode *this_local;
  
  local_20 = args;
  args_local = (shared_ptr<vmips::VirtReg> *)node;
  node_local = (shared_ptr<vmips::CFGNode> *)this;
  std::weak_ptr<vmips::CFGNode>::weak_ptr<vmips::CFGNode,void>(&local_30,node);
  std::vector<std::weak_ptr<vmips::CFGNode>,_std::allocator<std::weak_ptr<vmips::CFGNode>_>_>::
  push_back((vector<std::weak_ptr<vmips::CFGNode>,_std::allocator<std::weak_ptr<vmips::CFGNode>_>_>
             *)(this + 0x48),&local_30);
  std::weak_ptr<vmips::CFGNode>::~weak_ptr(&local_30);
  std::
  make_shared<vmips::beqz,std::shared_ptr<vmips::CFGNode>const&,std::shared_ptr<vmips::VirtReg>&>
            ((shared_ptr<vmips::CFGNode> *)local_50,args_local);
  std::shared_ptr<vmips::Instruction>::shared_ptr<vmips::beqz,void>
            (&local_60,(shared_ptr<vmips::beqz> *)local_50);
  std::
  vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
  ::push_back((vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
               *)(this + 0x30),&local_60);
  std::shared_ptr<vmips::Instruction>::~shared_ptr(&local_60);
  std::shared_ptr<vmips::beqz>::~shared_ptr((shared_ptr<vmips::beqz> *)local_50);
  return;
}

Assistant:

void branch_existing(const std::shared_ptr<CFGNode> &node, Args &&... args) {
            out_edges.push_back(node);
            auto instr = std::make_shared<Instr>(node, std::forward<Args>(args)...);
            instructions.push_back(instr);
        }